

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O3

DdNode * extraZddGetSingletonsBoth(DdManager *dd,DdNode *bVars)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *Q;
  DdNode *P;
  DdNode *data;
  
  if (dd->one == bVars) {
    return dd->one;
  }
  pDVar2 = cuddCacheLookup1Zdd(dd,extraZddGetSingletonsBoth,bVars);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = extraZddGetSingletonsBoth(dd,(bVars->type).kids.T);
  if (pDVar2 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  Q = cuddZddGetNode(dd,bVars->index * 2 + 1,dd->one,dd->zero);
  P = pDVar2;
  if (Q != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)Q & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    P = cuddZddUnion(dd,pDVar2,Q);
    if (P != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDerefZdd(dd,pDVar2);
      Cudd_RecursiveDerefZdd(dd,Q);
      Q = cuddZddGetNode(dd,bVars->index * 2,dd->one,dd->zero);
      if (Q == (DdNode *)0x0) goto LAB_00826743;
      piVar1 = (int *)(((ulong)Q & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      data = cuddZddUnion(dd,P,Q);
      pDVar2 = P;
      if (data != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDerefZdd(dd,P);
        Cudd_RecursiveDerefZdd(dd,Q);
        piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        cuddCacheInsert1(dd,extraZddGetSingletonsBoth,bVars,data);
        return data;
      }
    }
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    P = Q;
  }
LAB_00826743:
  Cudd_RecursiveDerefZdd(dd,P);
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraZddGetSingletonsBoth( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars)    /* the set of variables */
{
    DdNode * zRes;

    if ( bVars == b1 )
        return z1;

    if ( (zRes = cuddCacheLookup1Zdd(dd, extraZddGetSingletonsBoth, bVars)) )
        return zRes;
    else
    {
        DdNode * zTemp, * zPlus;          

        // solve subproblem
        zRes = extraZddGetSingletonsBoth( dd, cuddT(bVars) );
        if ( zRes == NULL ) 
            return NULL;
        cuddRef( zRes );

        
        // create the negative singleton
        zPlus = cuddZddGetNode( dd, 2*bVars->index+1, z1, z0 );
        if ( zPlus == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zPlus );

        // add these to the result
        zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
        if ( zRes == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
            return NULL;
        }
        cuddRef( zRes );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zPlus );
        

        // create the positive singleton
        zPlus = cuddZddGetNode( dd, 2*bVars->index, z1, z0 );
        if ( zPlus == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zPlus );

        // add these to the result
        zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
        if ( zRes == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
            return NULL;
        }
        cuddRef( zRes );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zPlus );

        cuddDeref( zRes );
        cuddCacheInsert1( dd, extraZddGetSingletonsBoth, bVars, zRes );
        return zRes;
    }
}